

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileBlockManager::IncreaseBlockReferenceCount
          (SingleFileBlockManager *this,block_id_t block_id)

{
  ::std::mutex::lock(&this->block_lock);
  IncreaseBlockReferenceCountInternal(this,block_id);
  pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
  return;
}

Assistant:

void SingleFileBlockManager::IncreaseBlockReferenceCount(block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	IncreaseBlockReferenceCountInternal(block_id);
}